

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

void __thiscall Matrix3f::transpose(Matrix3f *this)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  
  pfVar2 = this->m_elements + 1;
  pfVar5 = this->m_elements + 3;
  for (lVar3 = 0; pfVar4 = pfVar5, lVar6 = -2, lVar3 != 2; lVar3 = lVar3 + 1) {
    for (; lVar3 + lVar6 != 0; lVar6 = lVar6 + 1) {
      fVar1 = *pfVar4;
      *pfVar4 = pfVar2[lVar6 + 2];
      pfVar2[lVar6 + 2] = fVar1;
      pfVar4 = pfVar4 + 3;
    }
    pfVar2 = pfVar2 + 4;
    pfVar5 = pfVar5 + 4;
  }
  return;
}

Assistant:

void Matrix3f::transpose()
{
	float temp;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = i + 1; j < 3; ++j )
		{
			temp = ( *this )( i, j );
			( *this )( i, j ) = ( *this )( j, i );
			( *this )( j, i ) = temp;
		}
	}
}